

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O2

void __thiscall helics::apps::Clone::processArgs(Clone *this)

{
  shared_ptr<helics::helicsCLI11App> app;
  allocator<char> local_59;
  undefined1 local_58 [16];
  string local_48;
  string local_28;
  
  buildArgParserApp((Clone *)local_58);
  if ((this->super_App).deactivated == false) {
    CLI::App::parse((App *)local_58._0_8_,&(this->super_App).remArgs);
  }
  else if ((this->super_App).helpMode == true) {
    helicsCLI11App::remove_helics_specifics((helicsCLI11App *)local_58._0_8_);
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_58 + 0x10),"",&local_59);
    CLI::App::help(&local_28,(App *)local_58._0_8_,(string *)(local_58 + 0x10),Normal);
    std::operator<<((ostream *)&std::cout,(string *)&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)(local_58 + 0x10));
  }
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return;
}

Assistant:

void Clone::processArgs()
{
    auto app = buildArgParserApp();
    if (!deactivated) {
        app->parse(remArgs);
    } else if (helpMode) {
        app->remove_helics_specifics();
        std::cout << app->help();
    }
}